

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseFieldOptions
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  FieldOptions *options;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  undefined4 local_78;
  string_view local_68;
  undefined1 local_58 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *field_location_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&location.location_,"[");
  bVar1 = LookingAt(this,stack0xffffffffffffffc0);
  if (bVar1) {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_58,field_location,8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"[");
    bVar1 = Consume(this,local_68);
    if (bVar1) {
      do {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_88,"default");
        bVar1 = LookingAt(this,local_88);
        if (bVar1) {
          bVar1 = ParseDefaultAssignment(this,field,field_location,containing_file);
          if (!bVar1) {
            this_local._7_1_ = false;
            goto LAB_002bd5a7;
          }
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_98,"json_name");
          bVar1 = LookingAt(this,local_98);
          if (bVar1) {
            bVar1 = ParseJsonName(this,field,field_location,containing_file);
            if (!bVar1) {
              this_local._7_1_ = false;
              goto LAB_002bd5a7;
            }
          }
          else {
            options = FieldDescriptorProto::mutable_options(field);
            bVar1 = ParseOption(this,&options->super_Message,(LocationRecorder *)local_58,
                                containing_file,OPTION_ASSIGNMENT);
            if (!bVar1) {
              this_local._7_1_ = false;
              goto LAB_002bd5a7;
            }
          }
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,",");
        bVar1 = TryConsume(this,local_a8);
      } while (bVar1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"]");
      bVar1 = Consume(this,local_b8);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
LAB_002bd5a7:
    local_78 = 1;
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_58);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseFieldOptions(FieldDescriptorProto* field,
                               const LocationRecorder& field_location,
                               const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  // Parse field options.
  do {
    if (LookingAt("default")) {
      // We intentionally pass field_location rather than location here, since
      // the default value is not actually an option.
      DO(ParseDefaultAssignment(field, field_location, containing_file));
    } else if (LookingAt("json_name")) {
      // Like default value, this "json_name" is not an actual option.
      DO(ParseJsonName(field, field_location, containing_file));
    } else {
      DO(ParseOption(field->mutable_options(), location, containing_file,
                     OPTION_ASSIGNMENT));
    }
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}